

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_counter.cc
# Opt level: O0

bool __thiscall absl::lts_20240722::BlockingCounter::DecrementCount(BlockingCounter *this)

{
  int iVar1;
  atomic<int> *paVar2;
  MutexLock local_48;
  MutexLock l;
  char *absl_raw_log_internal_basename;
  int count;
  BlockingCounter *this_local;
  
  paVar2 = &this->count_;
  LOCK();
  iVar1 = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (-1 < iVar1 + -1) {
    if (iVar1 == 1) {
      MutexLock::MutexLock(&local_48,&this->lock_);
      this->done_ = true;
      MutexLock::~MutexLock(&local_48);
    }
    return iVar1 == 1;
  }
  l.mu_ = (Mutex *)0x1281d0;
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"blocking_counter.cc",0x29,"Check %s failed: %s","count >= 0",
             "BlockingCounter::DecrementCount() called too many times");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/synchronization/blocking_counter.cc"
                ,0x29,"bool absl::BlockingCounter::DecrementCount()");
}

Assistant:

bool BlockingCounter::DecrementCount() {
  int count = count_.fetch_sub(1, std::memory_order_acq_rel) - 1;
  ABSL_RAW_CHECK(count >= 0,
                 "BlockingCounter::DecrementCount() called too many times");
  if (count == 0) {
    MutexLock l(&lock_);
    done_ = true;
    return true;
  }
  return false;
}